

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSModuleDef * JS_NewCModule(JSContext *ctx,char *name_str,JSModuleInitFunc *func)

{
  JSAtom name;
  size_t len;
  JSModuleDef *pJVar1;
  
  len = strlen(name_str);
  name = JS_NewAtomLen(ctx,name_str,len);
  if (name == 0) {
    pJVar1 = (JSModuleDef *)0x0;
  }
  else {
    pJVar1 = js_new_module_def(ctx,name);
    pJVar1->init_func = func;
  }
  return pJVar1;
}

Assistant:

JSModuleDef *JS_NewCModule(JSContext *ctx, const char *name_str,
                           JSModuleInitFunc *func)
{
    JSModuleDef *m;
    JSAtom name;
    name = JS_NewAtom(ctx, name_str);
    if (name == JS_ATOM_NULL)
        return NULL;
    m = js_new_module_def(ctx, name);
    m->init_func = func;
    return m;
}